

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Session::~Session(Session *this)

{
  Config *pCVar1;
  
  cleanUp();
  pCVar1 = (this->m_config).m_ptr;
  if (pCVar1 != (Config *)0x0) {
    (*(pCVar1->super_IConfig)._vptr_IConfig[1])();
  }
  ConfigData::~ConfigData(&this->m_configData);
  Clara::Parser::~Parser(&this->m_cli);
  return;
}

Assistant:

Session::~Session() {
        Catch::cleanUp();
    }